

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

void UnserializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
               (CMutableTransaction *tx,ParamsStream<DataStream_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  vector<CTxOut,_std::allocator<CTxOut>_> *this;
  long lVar1;
  pointer pCVar2;
  byte bVar3;
  bool bVar4;
  uint32_t uVar5;
  char *pcVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = params->allow_witness;
  uVar5 = ser_readdata32<ParamsStream<DataStream&,TransactionSerParams>>(s);
  tx->version = uVar5;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::clear(&tx->vin);
  this = &tx->vout;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::clear(this);
  Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTxIn,std::allocator<CTxIn>>
            (s,&tx->vin);
  if (((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_finish ==
       (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start) && (bVar4 != false)) {
    bVar3 = ser_readdata8<ParamsStream<DataStream&,TransactionSerParams>>(s);
    if (bVar3 != 0) {
      Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTxIn,std::allocator<CTxIn>>
                (s,&tx->vin);
      Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTxOut,std::allocator<CTxOut>>
                (s,this);
      if ((bVar3 & 1) == 0) {
LAB_0013ae9f:
        pcVar6 = (char *)__cxa_allocate_exception(0x20);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar6,(error_code *)"Unknown transaction optional data");
      }
      else {
        lVar8 = 0x50;
        for (uVar7 = 0;
            pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar7 < (ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68)
            ; uVar7 = uVar7 + 1) {
          Unserialize<ParamsStream<DataStream&,TransactionSerParams>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (s,(vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)((long)&(pCVar2->prevout).hash + lVar8));
          lVar8 = lVar8 + 0x68;
        }
        bVar4 = CMutableTransaction::HasWitness(tx);
        if (bVar4) {
          if (bVar3 == 1) goto LAB_0013ae6e;
          goto LAB_0013ae9f;
        }
        pcVar6 = (char *)__cxa_allocate_exception(0x20);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar6,(error_code *)"Superfluous witness record");
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_0013af4c;
    }
  }
  else {
    Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTxOut,std::allocator<CTxOut>>
              (s,this);
  }
LAB_0013ae6e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar5 = ser_readdata32<ParamsStream<DataStream&,TransactionSerParams>>(s);
    tx->nLockTime = uVar5;
    return;
  }
LAB_0013af4c:
  __stack_chk_fail();
}

Assistant:

void UnserializeTransaction(TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s >> tx.version;
    unsigned char flags = 0;
    tx.vin.clear();
    tx.vout.clear();
    /* Try to read the vin. In case the dummy is there, this will be read as an empty vector. */
    s >> tx.vin;
    if (tx.vin.size() == 0 && fAllowWitness) {
        /* We read a dummy or an empty vin. */
        s >> flags;
        if (flags != 0) {
            s >> tx.vin;
            s >> tx.vout;
        }
    } else {
        /* We read a non-empty vin. Assume a normal vout follows. */
        s >> tx.vout;
    }
    if ((flags & 1) && fAllowWitness) {
        /* The witness flag is present, and we support witnesses. */
        flags ^= 1;
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s >> tx.vin[i].scriptWitness.stack;
        }
        if (!tx.HasWitness()) {
            /* It's illegal to encode witnesses when all witness stacks are empty. */
            throw std::ios_base::failure("Superfluous witness record");
        }
    }
    if (flags) {
        /* Unknown flag in the serialization */
        throw std::ios_base::failure("Unknown transaction optional data");
    }
    s >> tx.nLockTime;
}